

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O2

void test_init_start_stop_destroy_multiple_streams(int early,int delay_ms)

{
  int iVar1;
  anon_enum_32 *in_RCX;
  cubeb_stream **val1;
  anon_enum_32 *actual;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
  ;
  cubeb *message;
  char *pcVar2;
  cubeb_stream **stream_00;
  long lVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  int r;
  AssertionResult gtest_ar_2;
  AssertHelper local_b0;
  cubeb *ctx;
  uint local_9c;
  cubeb_stream_params local_98;
  cubeb_stream *stream [8];
  
  r = common_init(&ctx,"test_sanity");
  local_98._0_8_ = (ulong)local_98.rate << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            ((char *)stream,(char *)&r,(int *)&local_98,in_RCX);
  if ((char)stream[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    if (stream[1] == (cubeb_stream *)0x0) {
      message = (cubeb *)0x12ad72;
    }
    else {
      message = stream[1]->context;
    }
    iVar1 = 0x119;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(stream + 1));
    local_98.format = CUBEB_SAMPLE_S16LE;
    local_98.rate = 0;
    val1 = (cubeb_stream **)&ctx;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)stream,"ctx","nullptr",(cubeb **)val1,(void **)&local_98);
    if ((char)stream[0] != '\0') {
      local_9c = delay_ms;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(stream + 1));
      local_98.format = CUBEB_SAMPLE_S16LE;
      local_98.rate = 0xac44;
      local_98.channels = 1;
      local_98.layout = 4;
      local_98.prefs = CUBEB_STREAM_PREF_NONE;
      for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 8) {
        stream_00 = (cubeb_stream **)((long)stream + lVar3);
        actual = (anon_enum_32 *)0x0;
        r = cubeb_stream_init(ctx,stream_00,"test",(cubeb_devid)0x0,(cubeb_stream_params *)0x0,
                              (cubeb_devid)0x0,&local_98,0x113a,test_data_callback,
                              test_state_callback,&dummy);
        local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
        testing::internal::EqHelper<false>::Compare<int,__0>
                  (&gtest_ar_2.success_,(char *)&r,(int *)&local_d0,actual);
        if (gtest_ar_2.success_ == false) {
          testing::Message::Message((Message *)&local_d0);
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          iVar1 = 0x125;
LAB_00109f8e:
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                     ,iVar1,pcVar2);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_d0);
          this = &gtest_ar_2.message_;
          goto LAB_00109d4e;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_2.message_);
        local_d0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        val1 = stream_00;
        testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                  ((internal *)&gtest_ar_2,"stream[i]","nullptr",stream_00,&local_d0.ptr_);
        if (gtest_ar_2.success_ == false) {
          testing::Message::Message((Message *)&local_d0);
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          iVar1 = 0x126;
          goto LAB_00109f8e;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_2.message_);
        if (early != 0) {
          r = cubeb_stream_start(*stream_00);
          local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_2.success_,(char *)&r,(int *)&local_d0,(anon_enum_32 *)val1);
          if (gtest_ar_2.success_ == false) {
            testing::Message::Message((Message *)&local_d0);
            if (gtest_ar_2.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar1 = 0x129;
            goto LAB_00109f8e;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_2.message_);
        }
      }
      if (early == 0) {
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          r = cubeb_stream_start(stream[lVar3]);
          local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_2.success_,(char *)&r,(int *)&local_d0,(anon_enum_32 *)val1);
          if (gtest_ar_2.success_ == false) {
            testing::Message::Message((Message *)&local_d0);
            if (gtest_ar_2.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar1 = 0x130;
            goto LAB_0010a04d;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_2.message_);
        }
      }
      if (local_9c != 0) {
        delay(local_9c);
      }
      if (early == 0) {
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          r = cubeb_stream_stop(stream[lVar3]);
          local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_2.success_,(char *)&r,(int *)&local_d0,(anon_enum_32 *)val1);
          if (gtest_ar_2.success_ == false) {
            testing::Message::Message((Message *)&local_d0);
            if (gtest_ar_2.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar1 = 0x13b;
            goto LAB_0010a04d;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_2.message_);
        }
      }
      lVar3 = 0;
      do {
        if (lVar3 == 8) {
          cubeb_destroy(ctx);
          return;
        }
        if (early != 0) {
          r = cubeb_stream_stop(stream[lVar3]);
          local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_2.success_,(char *)&r,(int *)&local_d0,(anon_enum_32 *)val1);
          if (gtest_ar_2.success_ == false) {
            testing::Message::Message((Message *)&local_d0);
            if (gtest_ar_2.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar1 = 0x142;
LAB_0010a04d:
            this = &gtest_ar_2.message_;
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                       ,iVar1,pcVar2);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_d0);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_d0);
            goto LAB_00109d4e;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_2.message_);
        }
        cubeb_stream_destroy(stream[lVar3]);
        lVar3 = lVar3 + 1;
      } while( true );
    }
    testing::Message::Message((Message *)&local_98);
    if (stream[1] == (cubeb_stream *)0x0) {
      message = (cubeb *)0x12ad72;
    }
    else {
      message = stream[1]->context;
    }
    iVar1 = 0x11a;
  }
  this = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(stream + 1);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_2,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
             ,iVar1,(char *)message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_98);
LAB_00109d4e:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this);
  return;
}

Assistant:

static void
test_init_start_stop_destroy_multiple_streams(int early, int delay_ms)
{
  size_t i;
  int r;
  cubeb * ctx;
  cubeb_stream * stream[8];
  cubeb_stream_params params;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
    r = cubeb_stream_init(ctx, &stream[i], "test", NULL, NULL, NULL, &params, STREAM_LATENCY,
                          test_data_callback, test_state_callback, &dummy);
    ASSERT_EQ(r, CUBEB_OK);
    ASSERT_NE(stream[i], nullptr);
    if (early) {
      r = cubeb_stream_start(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  if (!early) {
    for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
      r = cubeb_stream_start(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  if (delay_ms) {
    delay(delay_ms);
  }

  if (!early) {
    for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
      r = cubeb_stream_stop(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
    if (early) {
      r = cubeb_stream_stop(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
    cubeb_stream_destroy(stream[i]);
  }

  cubeb_destroy(ctx);
}